

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimSeq.c
# Opt level: O2

uint * Raig_ManSimRef(Raig_Man_t *p,int i)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  
  if (i < 2) {
    __assert_fail("i > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                  ,0xe6,"unsigned int *Raig_ManSimRef(Raig_Man_t *, int)");
  }
  puVar4 = p->pSims;
  if (puVar4[(uint)i] != 0) {
    __assert_fail("p->pSims[i] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                  ,0xe7,"unsigned int *Raig_ManSimRef(Raig_Man_t *, int)");
  }
  uVar5 = p->MemFree;
  if (uVar5 != 0) {
    puVar3 = p->pMems;
    goto LAB_005272e0;
  }
  iVar1 = p->nWordsAlloc;
  puVar4 = p->pMems;
  if ((long)iVar1 == 0) {
    if (puVar4 != (uint *)0x0) {
      __assert_fail("p->pMems == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                    ,0xed,"unsigned int *Raig_ManSimRef(Raig_Man_t *, int)");
    }
    p->nWordsAlloc = 0x40000;
    p->nMems = 1;
    uVar5 = 0x40000;
LAB_00527269:
    puVar3 = (uint *)malloc((long)(int)uVar5 << 2);
  }
  else {
    uVar5 = iVar1 * 2;
    p->nWordsAlloc = uVar5;
    if (puVar4 == (uint *)0x0) goto LAB_00527269;
    puVar3 = (uint *)realloc(puVar4,(long)iVar1 << 3);
    uVar5 = p->nWordsAlloc;
  }
  piVar7 = &p->MemFree;
  p->pMems = puVar3;
  iVar2 = p->nWords;
  iVar1 = iVar2 + 1;
  memset(puVar3,0xff,(long)iVar1 * 4);
  for (uVar6 = iVar1 * p->nMems; iVar1 + uVar6 < uVar5; uVar6 = uVar6 + iVar2 + 1) {
    *piVar7 = uVar6;
    piVar7 = (int *)(puVar3 + uVar6);
  }
  *piVar7 = 0;
  uVar5 = p->MemFree;
  puVar4 = p->pSims;
LAB_005272e0:
  puVar4[(uint)i] = uVar5;
  puVar3 = puVar3 + p->MemFree;
  p->MemFree = *puVar3;
  *puVar3 = p->pRefs[(uint)i];
  iVar2 = p->nMems;
  iVar1 = iVar2 + 1;
  p->nMems = iVar1;
  if (p->nMemsMax <= iVar2) {
    p->nMemsMax = iVar1;
  }
  return puVar3;
}

Assistant:

unsigned * Raig_ManSimRef( Raig_Man_t * p, int i )
{
    unsigned * pSim;
    assert( i > 1 );
    assert( p->pSims[i] == 0 );
    if ( p->MemFree == 0 )
    {
        unsigned * pPlace, Ent;
        if ( p->nWordsAlloc == 0 )
        {
            assert( p->pMems == NULL );
            p->nWordsAlloc = (1<<17); // -> 1Mb
            p->nMems = 1;
        }
        p->nWordsAlloc *= 2;
        p->pMems = ABC_REALLOC( unsigned, p->pMems, p->nWordsAlloc );
        memset( p->pMems, 0xff, sizeof(unsigned) * (p->nWords + 1) );
        pPlace = (unsigned *)&p->MemFree;
        for ( Ent = p->nMems * (p->nWords + 1); 
              Ent + p->nWords + 1 < (unsigned)p->nWordsAlloc; 
              Ent += p->nWords + 1 )
        {
            *pPlace = Ent;
            pPlace = p->pMems + Ent;
        }
        *pPlace = 0;
    }
    p->pSims[i] = p->MemFree;
    pSim = p->pMems + p->MemFree;
    p->MemFree = pSim[0];
    pSim[0] = p->pRefs[i];
    p->nMems++;
    if ( p->nMemsMax < p->nMems )
        p->nMemsMax = p->nMems;
    return pSim;
}